

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generator.hpp
# Opt level: O0

shared_ptr<int> __thiscall
strq::Generator<std::shared_ptr<int>,void>::operator()
          (Generator<std::shared_ptr<int>,void> *this,
          Compound<strq::Arithmetic<strq::detail::NoDistribution>_> *schema)

{
  int iVar1;
  int *__p;
  tuple<strq::Arithmetic<strq::detail::NoDistribution>_> *__t;
  __tuple_element_t<0UL,_tuple<Arithmetic<NoDistribution>_>_> *schema_00;
  Compound<strq::Arithmetic<strq::detail::NoDistribution>_> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<int> sVar2;
  Compound<strq::Arithmetic<strq::detail::NoDistribution>_> *schema_local;
  Generator<std::shared_ptr<int>,_void> *this_local;
  
  __p = (int *)operator_new(4);
  __t = Compound<strq::Arithmetic<strq::detail::NoDistribution>_>::values(in_RDX);
  schema_00 = std::get<0ul,strq::Arithmetic<strq::detail::NoDistribution>>(__t);
  iVar1 = random<int,strq::Arithmetic<strq::detail::NoDistribution>const&>(schema_00);
  *__p = iVar1;
  std::shared_ptr<int>::shared_ptr<int,void>((shared_ptr<int> *)this,__p);
  sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<int>)sVar2.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

auto operator() (Schema&& schema) -> T
        {
            return T {new typename T::element_type {
                    random<typename T::element_type>(std::get<0>(schema.values()))
            }};
        }